

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O2

string * trng::lagfib2plus<unsigned_int,168u,521u>::init_name_abi_cxx11_(void)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream name_str;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&name_str);
  poVar1 = std::operator<<(local_180,"lagfib2plus_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
  poVar1 = std::operator<<(poVar1,'_');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'_');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&name_str);
  return in_RDI;
}

Assistant:

static std::string init_name() {
      std::stringstream name_str;
      name_str << "lagfib2plus_" << std::numeric_limits<result_type>::digits << '_' << A << '_'
               << B;
      return name_str.str();
    }